

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O3

UniValue * __thiscall
CRPCConvertTable::ArgToUniValue
          (UniValue *__return_storage_ptr__,CRPCConvertTable *this,string_view arg_value,
          string *method,int param_idx)

{
  pointer pcVar1;
  string_view raw;
  const_iterator cVar2;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffff88;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  key_type local_60;
  long local_38;
  
  local_70._M_str = arg_value._M_str;
  local_70._M_len = arg_value._M_len;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_60.first._M_dataplus._M_p = (pointer)&local_60.first.field_2;
  pcVar1 = (method->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + method->_M_string_length);
  local_60.second = param_idx;
  cVar2 = std::
          _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Identity<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find((_Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Identity<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)this,&local_60);
  if ((_Rb_tree_header *)cVar2._M_node == &(this->members)._M_t._M_impl.super__Rb_tree_header) {
    ::UniValue::
    UniValue<std::basic_string_view<char,_std::char_traits<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>,_true>
              (__return_storage_ptr__,&local_70);
  }
  else {
    raw._M_str = in_stack_ffffffffffffff88;
    raw._M_len = 0x841b53;
    Parse(raw);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first._M_dataplus._M_p != &local_60.first.field_2) {
    operator_delete(local_60.first._M_dataplus._M_p,local_60.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue ArgToUniValue(std::string_view arg_value, const std::string& method, int param_idx)
    {
        return members.count({method, param_idx}) > 0 ? Parse(arg_value) : arg_value;
    }